

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_buf.cpp
# Opt level: O0

ssize_t __thiscall net::SocketBuf::write(SocketBuf *this,int __fd,void *__buf,size_t __n)

{
  void *pvVar1;
  undefined4 in_register_00000034;
  size_t len_local;
  char *data_local;
  SocketBuf *this_local;
  
  if ((void *)CONCAT44(in_register_00000034,__fd) == (void *)0x0 || __buf == (void *)0x0) {
    __assert_fail("data != NULL && len > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/distanceNing[P]benchmarkTool/socket/socket_buf.cpp"
                  ,0x27,"void net::SocketBuf::write(const char *, size_t)");
  }
  pvVar1 = (void *)writeableBytes(this);
  if (pvVar1 < __buf) {
    grow(this,(size_t)__buf);
  }
  memcpy(this->buffer_ + this->writeIndex_,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf
        );
  this->writeIndex_ = (long)__buf + this->writeIndex_;
  return (ssize_t)this;
}

Assistant:

void net::SocketBuf::write(const char* data, size_t len)
{
    assert(data != NULL && len > 0);
    if (len > writeableBytes()) {
        grow(len);
    }
    memcpy(buffer_ + writeIndex_, data, len);
    writeIndex_ += len;
}